

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

const_iterator __thiscall
duckdb::ModeState<float,_duckdb::ModeStandard<float>_>::Scan
          (ModeState<float,_duckdb::ModeStandard<float>_> *this)

{
  ulong uVar1;
  _Node_iterator_base<std::pair<const_float,_duckdb::ModeAttr>,_false> _Var2;
  iterator i;
  _Node_iterator_base<std::pair<const_float,_duckdb::ModeAttr>,_false> _Var3;
  
  _Var2._M_cur = (__node_type *)(this->frequency_map->_M_h)._M_before_begin._M_nxt;
  for (_Var3._M_cur = _Var2._M_cur; _Var3._M_cur != (__node_type *)0x0;
      _Var3._M_cur = (__node_type *)((_Var3._M_cur)->super__Hash_node_base)._M_nxt) {
    uVar1 = *(ulong *)((long)&((_Var3._M_cur)->
                              super__Hash_node_value<std::pair<const_float,_duckdb::ModeAttr>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_float,_duckdb::ModeAttr>_>
                              ._M_storage._M_storage + 8);
    if ((*(ulong *)((long)_Var2._M_cur + 0x10) < uVar1) ||
       ((uVar1 == *(ulong *)((long)_Var2._M_cur + 0x10) &&
        (*(ulong *)((long)&((_Var3._M_cur)->
                           super__Hash_node_value<std::pair<const_float,_duckdb::ModeAttr>,_false>).
                           super__Hash_node_value_base<std::pair<const_float,_duckdb::ModeAttr>_>.
                           _M_storage._M_storage + 0x10) < *(ulong *)((long)_Var2._M_cur + 0x18)))))
    {
      _Var2._M_cur = _Var3._M_cur;
    }
  }
  return (const_iterator)_Var2._M_cur;
}

Assistant:

typename Counts::const_iterator Scan() const {
		//! Initialize control variables to first variable of the frequency map
		auto highest_frequency = frequency_map->begin();
		for (auto i = highest_frequency; i != frequency_map->end(); ++i) {
			// Tie break with the lowest insert position
			if (i->second.count > highest_frequency->second.count ||
			    (i->second.count == highest_frequency->second.count &&
			     i->second.first_row < highest_frequency->second.first_row)) {
				highest_frequency = i;
			}
		}
		return highest_frequency;
	}